

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O2

string * __thiscall
tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (string *__return_storage_ptr__,tlog *this,duration<long,_std::ratio<1L,_1000000L>_> dur)

{
  long __val;
  long __val_00;
  long lVar1;
  string *this_00;
  long lVar2;
  string sStack_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &sStack_228;
  lVar1 = (long)this % 86400000000;
  lVar2 = lVar1 % 3600000000;
  __val = lVar2 / 60000000;
  __val_00 = (lVar2 % 60000000) / 1000000;
  if ((long)this < 86400000000) {
    if (lVar1 < 3600000000) {
      if (lVar2 < 60000000) {
        std::__cxx11::to_string(&sStack_228,__val_00);
        std::operator+(__return_storage_ptr__,&sStack_228,'s');
      }
      else {
        std::__cxx11::to_string(&local_1c8,__val);
        std::operator+(&local_1e8,&local_1c8,'m');
        std::__cxx11::to_string(&local_148,__val_00);
        padFromLeft(&local_208,&local_148,2,'0');
        std::operator+(&sStack_228,&local_1e8,&local_208);
        std::operator+(__return_storage_ptr__,&sStack_228,'s');
        std::__cxx11::string::~string((string *)&sStack_228);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_1e8);
        this_00 = &local_1c8;
      }
    }
    else {
      std::__cxx11::to_string(&local_168,lVar1 / 3600000000);
      std::operator+(&local_208,&local_168,'h');
      std::__cxx11::to_string(&local_108,__val);
      padFromLeft(&local_1a8,&local_108,2,'0');
      std::operator+(&local_1c8,&local_208,&local_1a8);
      std::operator+(&local_1e8,&local_1c8,'m');
      std::__cxx11::to_string(&local_128,__val_00);
      padFromLeft(&local_188,&local_128,2,'0');
      std::operator+(&sStack_228,&local_1e8,&local_188);
      std::operator+(__return_storage_ptr__,&sStack_228,'s');
      std::__cxx11::string::~string((string *)&sStack_228);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_208);
      this_00 = &local_168;
    }
  }
  else {
    std::__cxx11::to_string(&local_188,(long)this / 86400000000);
    std::operator+(&local_1a8,&local_188,'d');
    std::__cxx11::to_string(&local_68,lVar1 / 3600000000);
    padFromLeft(&local_48,&local_68,2,'0');
    std::operator+(&local_168,&local_1a8,&local_48);
    std::operator+(&local_208,&local_168,'h');
    std::__cxx11::to_string(&local_a8,__val);
    padFromLeft(&local_88,&local_a8,2,'0');
    std::operator+(&local_1c8,&local_208,&local_88);
    std::operator+(&local_1e8,&local_1c8,'m');
    std::__cxx11::to_string(&local_e8,__val_00);
    padFromLeft(&local_c8,&local_e8,2,'0');
    std::operator+(&sStack_228,&local_1e8,&local_c8);
    std::operator+(__return_storage_ptr__,&sStack_228,'s');
    std::__cxx11::string::~string((string *)&sStack_228);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_1a8);
    this_00 = &local_188;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string durationToString(T dur) {
        using namespace std::chrono;
        using day_t = duration<long long, std::ratio<3600 * 24>>;

        auto d = duration_cast<day_t>(dur);
        auto h = duration_cast<hours>(dur -= d);
        auto m = duration_cast<minutes>(dur -= h);
        auto s = duration_cast<seconds>(dur -= m);

        if (d.count() > 0) {
            return
                std::to_string(d.count()) + 'd' +
                padFromLeft(std::to_string(h.count()), 2, '0') + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (h.count() > 0) {
            return
                std::to_string(h.count()) + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (m.count() > 0) {
            return
                std::to_string(m.count()) + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else {
            return std::to_string(s.count()) + 's';
        }
    }